

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# const_folding_rules.cpp
# Opt level: O1

Constant *
spvtools::opt::anon_unknown_0::FoldTranspose
          (IRContext *context,Instruction *inst,
          vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
          *constants)

{
  TypeManager *this;
  ConstantManager *this_00;
  iterator __position;
  void *pvVar1;
  pointer pvVar2;
  bool bVar3;
  uint32_t uVar4;
  int iVar5;
  Type *pTVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Constant *pCVar7;
  undefined4 extraout_var_01;
  long *plVar8;
  long lVar9;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  long *plVar10;
  Instruction *pIVar11;
  Constant *pCVar12;
  ulong uVar13;
  size_type sVar14;
  vector<unsigned_int,_std::allocator<unsigned_int>_> result_columns;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  result_elements;
  allocator_type local_81;
  ulong local_80;
  Type *local_78;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_70;
  long *local_58;
  long *local_50;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_48;
  
  if (inst->opcode_ != OpTranspose) {
    __assert_fail("inst->opcode() == spv::Op::OpTranspose",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp"
                  ,0x195,
                  "const analysis::Constant *spvtools::opt::(anonymous namespace)::FoldTranspose(IRContext *, Instruction *, const std::vector<const analysis::Constant *> &)"
                 );
  }
  if ((context->valid_analyses_ & kAnalysisTypes) == kAnalysisNone) {
    IRContext::BuildTypeManager(context);
  }
  this = (context->type_mgr_)._M_t.
         super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
         ._M_t.
         super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
         .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>._M_head_impl;
  bVar3 = Instruction::IsFloatingPointFoldingAllowed(inst);
  if (!bVar3) {
    uVar4 = 0;
    if (inst->has_type_id_ == true) {
      uVar4 = Instruction::GetSingleWordOperand(inst,0);
    }
    pTVar6 = analysis::TypeManager::GetType(this,uVar4);
    bVar3 = HasFloatingPoint(pTVar6);
    if (bVar3) {
      return (Constant *)0x0;
    }
  }
  pCVar7 = *(constants->
            super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pCVar12 = (Constant *)0x0;
  uVar4 = 0;
  if (pCVar7 != (Constant *)0x0) {
    if (inst->has_type_id_ == true) {
      uVar4 = Instruction::GetSingleWordOperand(inst,0);
    }
    pTVar6 = analysis::TypeManager::GetType(this,uVar4);
    iVar5 = (*pTVar6->_vptr_Type[0xf])(pTVar6);
    local_78 = (Type *)CONCAT44(extraout_var,iVar5);
    if ((context->valid_analyses_ & kAnalysisConstants) == kAnalysisNone) {
      IRContext::BuildConstantManager(context);
    }
    this_00 = (context->constant_mgr_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::analysis::ConstantManager,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::analysis::ConstantManager_*,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
              .super__Head_base<0UL,_spvtools::opt::analysis::ConstantManager_*,_false>._M_head_impl
    ;
    iVar5 = (*pCVar7->_vptr_Constant[0x16])(pCVar7);
    if (CONCAT44(extraout_var_00,iVar5) != 0) {
      pCVar7 = analysis::ConstantManager::GetNullCompositeConstant(this_00,local_78);
      return pCVar7;
    }
    iVar5 = (*pCVar7->_vptr_Constant[0x14])(pCVar7);
    plVar8 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_01,iVar5) + 0xc0))
                               ((long *)CONCAT44(extraout_var_01,iVar5));
    lVar9 = (**(code **)(**(long **)(*(long *)*plVar8 + 8) + 0x70))();
    local_80 = (ulong)*(uint *)(lVar9 + 0x30);
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::vector(&local_48,local_80,(allocator_type *)&local_70);
    plVar10 = (long *)*plVar8;
    local_58 = (long *)plVar8[1];
    if (plVar10 != local_58) {
      do {
        pCVar7 = (Constant *)*plVar10;
        local_50 = plVar10;
        iVar5 = (*pCVar7->_vptr_Constant[0x16])(pCVar7);
        if (CONCAT44(extraout_var_02,iVar5) != 0) {
          pCVar7 = analysis::ConstantManager::GetNullCompositeConstant(this_00,pCVar7->type_);
        }
        iVar5 = (*pCVar7->_vptr_Constant[0x13])(pCVar7);
        plVar10 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_03,iVar5) + 0xc0))
                                    ((long *)CONCAT44(extraout_var_03,iVar5));
        if (local_80 != 0) {
          lVar9 = 0;
          uVar13 = 0;
          do {
            pvVar2 = local_48.
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            uVar4 = 0;
            pIVar11 = analysis::ConstantManager::GetDefiningInstruction
                                (this_00,*(Constant **)(*plVar10 + uVar13 * 8),0,
                                 (inst_iterator *)0x0);
            if (pIVar11->has_result_id_ == true) {
              uVar4 = Instruction::GetSingleWordOperand(pIVar11,(uint)pIVar11->has_type_id_);
            }
            __position._M_current =
                 *(uint **)((long)&(pvVar2->
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                   _M_impl.super__Vector_impl_data._M_finish + lVar9);
            local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start._0_4_ = uVar4;
            if (__position._M_current ==
                *(uint **)((long)&(pvVar2->
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                  _M_impl.super__Vector_impl_data._M_end_of_storage + lVar9)) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         ((long)&(pvVar2->
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                 _M_impl.super__Vector_impl_data._M_start + lVar9),__position,
                         (uint *)&local_70);
            }
            else {
              *__position._M_current = uVar4;
              *(uint **)((long)&(pvVar2->
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                _M_impl.super__Vector_impl_data._M_finish + lVar9) =
                   __position._M_current + 1;
            }
            uVar13 = uVar13 + 1;
            lVar9 = lVar9 + 0x18;
          } while (local_80 != uVar13);
        }
        plVar10 = local_50 + 1;
      } while (plVar10 != local_58);
    }
    uVar13 = local_80;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_70,local_80,&local_81);
    pTVar6 = local_78;
    if (uVar13 != 0) {
      lVar9 = 0;
      sVar14 = 0;
      do {
        pCVar7 = analysis::ConstantManager::GetConstant
                           (this_00,(Type *)pTVar6[1]._vptr_Type,
                            (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                            ((long)&((local_48.
                                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                                    ._M_impl.super__Vector_impl_data._M_start + lVar9));
        pIVar11 = analysis::ConstantManager::GetDefiningInstruction
                            (this_00,pCVar7,0,(inst_iterator *)0x0);
        uVar4 = 0;
        if (pIVar11->has_result_id_ == true) {
          uVar4 = Instruction::GetSingleWordOperand(pIVar11,(uint)pIVar11->has_type_id_);
        }
        *(uint32_t *)
         (CONCAT44(local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start._4_4_,
                   (uint)local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start) + sVar14 * 4) = uVar4;
        sVar14 = sVar14 + 1;
        lVar9 = lVar9 + 0x18;
      } while (local_80 != sVar14);
    }
    pCVar12 = analysis::ConstantManager::GetConstant(this_00,pTVar6,&local_70);
    pvVar1 = (void *)CONCAT44(local_70.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start._4_4_,
                              (uint)local_70.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,(long)local_70.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar1)
      ;
    }
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::~vector(&local_48);
  }
  return pCVar12;
}

Assistant:

const analysis::Constant* FoldTranspose(
    IRContext* context, Instruction* inst,
    const std::vector<const analysis::Constant*>& constants) {
  assert(inst->opcode() == spv::Op::OpTranspose);

  analysis::TypeManager* type_mgr = context->get_type_mgr();
  if (!inst->IsFloatingPointFoldingAllowed()) {
    if (HasFloatingPoint(type_mgr->GetType(inst->type_id()))) {
      return nullptr;
    }
  }

  const analysis::Constant* matrix = constants[0];
  if (matrix == nullptr) {
    return nullptr;
  }

  auto* result_type = type_mgr->GetType(inst->type_id());
  return TransposeMatrix(matrix, result_type->AsMatrix(), context);
}